

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_756638::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  cmLocalGenerator *this_00;
  ulong uVar1;
  cmOutputConverter *local_598;
  allocator<char> local_569;
  string local_568;
  cmListFileBacktrace local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_518;
  Value local_4e8;
  allocator<char> local_4b9;
  string local_4b8;
  cmListFileBacktrace local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_468;
  Value local_438;
  allocator<char> local_409;
  string local_408;
  cmListFileBacktrace local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3b8;
  Value local_388;
  allocator<char> local_359;
  string local_358;
  cmListFileBacktrace local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_308;
  Value local_2d8;
  allocator<char> local_2a9;
  string local_2a8;
  cmListFileBacktrace local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_250;
  Value local_220;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  cmStateSnapshot local_158;
  cmStateDirectory local_140;
  undefined1 local_118 [8];
  cmLinkLineComputer linkLineComputer;
  cmLocalGenerator *lg;
  string linkLibs;
  string linkPath;
  string frameworkPath;
  string linkFlags;
  string linkLanguageFlags;
  Target *this_local;
  Value *linkFragments;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&lg);
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  local_598 = (cmOutputConverter *)0x0;
  if (this_00 != (cmLocalGenerator *)0x0) {
    local_598 = &this_00->super_cmOutputConverter;
  }
  cmLocalGenerator::GetStateSnapshot(&local_158,this_00);
  cmStateSnapshot::GetDirectory(&local_140,&local_158);
  cmLinkLineComputer::cmLinkLineComputer((cmLinkLineComputer *)local_118,local_598,&local_140);
  cmLocalGenerator::GetTargetFlags
            (this_00,(cmLinkLineComputer *)local_118,this->Config,(string *)&lg,
             (string *)((long)&linkFlags.field_2 + 8),(string *)((long)&frameworkPath.field_2 + 8),
             (string *)((long)&linkPath.field_2 + 8),(string *)((long)&linkLibs.field_2 + 8),
             this->GT);
  cmSystemTools::TrimWhitespace(&local_178,(string *)((long)&linkFlags.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(linkFlags.field_2._M_local_buf + 8),(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  cmSystemTools::TrimWhitespace(&local_198,(string *)((long)&frameworkPath.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  cmSystemTools::TrimWhitespace(&local_1b8,(string *)((long)&linkPath.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(linkPath.field_2._M_local_buf + 8),(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  cmSystemTools::TrimWhitespace(&local_1d8,(string *)((long)&linkLibs.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(linkLibs.field_2._M_local_buf + 8),(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  cmSystemTools::TrimWhitespace(&local_1f8,(string *)&lg);
  std::__cxx11::string::operator=((string *)&lg,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&local_270,(string *)(linkFlags.field_2._M_local_buf + 8));
    local_288.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_288.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_288);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_250,&local_270,&local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"flags",&local_2a9);
    DumpCommandFragment(&local_220,this,&local_250,&local_2a8);
    Json::Value::append(__return_storage_ptr__,&local_220);
    Json::Value::~Value(&local_220);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_250);
    cmListFileBacktrace::~cmListFileBacktrace(&local_288);
    std::__cxx11::string::~string((string *)&local_270);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&local_328,(string *)(frameworkPath.field_2._M_local_buf + 8));
    local_338.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_338.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_338);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_308,&local_328,&local_338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"flags",&local_359);
    DumpCommandFragment(&local_2d8,this,&local_308,&local_358);
    Json::Value::append(__return_storage_ptr__,&local_2d8);
    Json::Value::~Value(&local_2d8);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_308);
    cmListFileBacktrace::~cmListFileBacktrace(&local_338);
    std::__cxx11::string::~string((string *)&local_328);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_3d8,(string *)(linkPath.field_2._M_local_buf + 8))
    ;
    local_3e8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_3e8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_3e8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_3b8,&local_3d8,&local_3e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"frameworkPath",&local_409);
    DumpCommandFragment(&local_388,this,&local_3b8,&local_408);
    Json::Value::append(__return_storage_ptr__,&local_388);
    Json::Value::~Value(&local_388);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_3b8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_3e8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_488,(string *)(linkLibs.field_2._M_local_buf + 8))
    ;
    local_498.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_498.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_498);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_468,&local_488,&local_498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"libraryPath",&local_4b9);
    DumpCommandFragment(&local_438,this,&local_468,&local_4b8);
    Json::Value::append(__return_storage_ptr__,&local_438);
    Json::Value::~Value(&local_438);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_468);
    cmListFileBacktrace::~cmListFileBacktrace(&local_498);
    std::__cxx11::string::~string((string *)&local_488);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_538,(string *)&lg);
    local_548.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_548.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_548);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_518,&local_538,&local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"libraries",&local_569);
    DumpCommandFragment(&local_4e8,this,&local_518,&local_568);
    Json::Value::append(__return_storage_ptr__,&local_4e8);
    Json::Value::~Value(&local_4e8);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_518);
    cmListFileBacktrace::~cmListFileBacktrace(&local_548);
    std::__cxx11::string::~string((string *)&local_538);
  }
  cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_118);
  std::__cxx11::string::~string((string *)&lg);
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmLinkLineComputer linkLineComputer(lg,
                                      lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(&linkLineComputer, this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
  linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
  frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
  linkPath = cmSystemTools::TrimWhitespace(linkPath);
  linkLibs = cmSystemTools::TrimWhitespace(linkLibs);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkFlags), "flags"));
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkPath), "libraryPath"));
  }

  if (!linkLibs.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLibs), "libraries"));
  }

  return linkFragments;
}